

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionSquare<float,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          float **transitionMatrices,int count)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  float *pfVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  float *pfVar16;
  ulong uVar17;
  float *pfVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  float distance;
  ulong local_90;
  
  if (0 < count) {
    local_90 = 0;
    auVar27 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      if (0 < (this->super_EigenDecomposition<float,_1>).kCategoryCount) {
        pfVar2 = transitionMatrices[probabilityIndices[local_90]];
        fVar21 = (float)edgeLengths[local_90];
        lVar8 = 0;
        iVar10 = 0;
        do {
          iVar19 = eigenIndices[lVar8];
          pfVar18 = this->gEMatrices[iVar19];
          uVar5 = (this->super_EigenDecomposition<float,_1>).kStateCount;
          lVar6 = (long)(int)uVar5;
          if (0 < lVar6) {
            pfVar12 = this->gIMatrices[iVar19];
            pfVar16 = (this->super_EigenDecomposition<float,_1>).gEigenValues[iVar19];
            iVar19 = 0;
            do {
              if (this->isComplex == true) {
                fVar22 = pfVar16[lVar6 + iVar19];
                if ((fVar22 == 0.0) && (!NAN(fVar22))) goto LAB_0013df5b;
                iVar20 = iVar19 + 1;
                dVar24 = exp((double)(fVar21 * pfVar16[iVar19]));
                dVar23 = cos((double)(fVar21 * fVar22));
                dVar25 = sin((double)(fVar21 * fVar22));
                iVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                if (0 < (long)iVar1) {
                  dVar23 = (double)(float)dVar24 * dVar23;
                  auVar26._0_4_ = (float)dVar23;
                  auVar26._4_4_ = (int)((ulong)dVar23 >> 0x20);
                  auVar26._8_8_ = 0;
                  fVar22 = (float)(dVar25 * (double)(float)dVar24);
                  pfVar3 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  lVar11 = (long)(iVar1 * iVar20);
                  lVar14 = (long)(iVar19 * iVar1);
                  lVar15 = 0;
                  do {
                    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * pfVar12[lVar11 + lVar15])),
                                             auVar26,ZEXT416((uint)pfVar12[lVar14 + lVar15]));
                    pfVar3[lVar14 + lVar15] = auVar4._0_4_;
                    auVar4 = vfmsub231ss_fma(ZEXT416((uint)(fVar22 * pfVar12[lVar14 + lVar15])),
                                             auVar26,ZEXT416((uint)pfVar12[lVar11 + lVar15]));
                    pfVar3[lVar11 + lVar15] = auVar4._0_4_;
                    lVar15 = lVar15 + 1;
                  } while (iVar1 != lVar15);
                }
              }
              else {
LAB_0013df5b:
                dVar23 = exp((double)(fVar21 * pfVar16[iVar19]));
                iVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                iVar20 = iVar19;
                if (0 < (long)iVar1) {
                  pfVar3 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  lVar11 = 0;
                  do {
                    pfVar3[iVar1 * iVar19 + lVar11] =
                         (float)dVar23 * pfVar12[iVar1 * iVar19 + lVar11];
                    lVar11 = lVar11 + 1;
                  } while (iVar1 != lVar11);
                }
              }
              auVar27 = ZEXT1664(ZEXT816(0) << 0x40);
              iVar19 = iVar20 + 1;
              uVar5 = (this->super_EigenDecomposition<float,_1>).kStateCount;
            } while (iVar19 < (int)uVar5);
          }
          if (0 < (int)uVar5) {
            uVar7 = (ulong)uVar5;
            uVar9 = 0;
            do {
              pfVar12 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
              uVar13 = 0;
              lVar6 = (long)iVar10;
              do {
                lVar11 = lVar6;
                auVar26 = ZEXT816(0) << 0x40;
                uVar17 = 0;
                pfVar16 = pfVar12;
                do {
                  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)pfVar18[uVar17]),
                                            ZEXT416((uint)*pfVar16));
                  uVar17 = uVar17 + 1;
                  pfVar16 = pfVar16 + uVar7;
                } while (uVar7 != uVar17);
                auVar26 = vmaxss_avx(auVar26,auVar27._0_16_);
                pfVar2[lVar11] = auVar26._0_4_;
                uVar13 = uVar13 + 1;
                pfVar12 = pfVar12 + 1;
                lVar6 = lVar11 + 1;
              } while (uVar13 != uVar7);
              pfVar2[(int)(lVar11 + 1)] = 1.0;
              iVar10 = (int)lVar11 + 2;
              uVar9 = uVar9 + 1;
              pfVar18 = pfVar18 + uVar7;
            } while (uVar9 != uVar7);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (this->super_EigenDecomposition<float,_1>).kCategoryCount);
      }
      local_90 = local_90 + 1;
    } while (local_90 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            const REALTYPE distance = edgeLength;
            const REALTYPE* Ievc = gIMatrices[eigenIndices[l]];
            const REALTYPE* Evec = gEMatrices[eigenIndices[l]];
            const REALTYPE* Eval = gEigenValues[eigenIndices[l]];
            const REALTYPE* EvalImag = Eval + kStateCount;
            for(int i=0; i<kStateCount; i++) {
                if (!isComplex || EvalImag[i] == 0) {
                    const REALTYPE tmp = exp(Eval[i] * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
                    }
                } else {
                    // 2 x 2 conjugate block
                    int i2 = i + 1;
                    const REALTYPE b = EvalImag[i];
                    const REALTYPE expat = exp(Eval[i] * distance);
                    const REALTYPE expatcosbt = expat * cos(b * distance);
                    const REALTYPE expatsinbt = expat * sin(b * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
                                                      expatsinbt * Ievc[i2*kStateCount+j];
                        matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
                                                      expatsinbt * Ievc[ i*kStateCount+j];
                    }
                    i++; // processed two conjugate rows
                }
            }

#ifdef DEBUG_COMPLEX
            fprintf(stderr,"[");
                for(int i=0; i<16; i++)
                    fprintf(stderr," %7.5e,",matrixTmp[i]);
                fprintf(stderr,"] -- complex debug\n");
                exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
            int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}